

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3RepackSegdirLevel(Fts3Table *p,sqlite3_int64 iAbsLevel)

{
  int iVar1;
  void *pvVar2;
  int *aNew;
  sqlite3_stmt *psStack_48;
  int rc2;
  sqlite3_stmt *pUpdate;
  sqlite3_stmt *pSelect;
  int local_30;
  int i;
  int nAlloc;
  int nIdx;
  int *aIdx;
  sqlite3_int64 sStack_18;
  int rc;
  sqlite3_int64 iAbsLevel_local;
  Fts3Table *p_local;
  
  _nAlloc = (void *)0x0;
  i = 0;
  local_30 = 0;
  pUpdate = (sqlite3_stmt *)0x0;
  psStack_48 = (sqlite3_stmt *)0x0;
  sStack_18 = iAbsLevel;
  iAbsLevel_local = (sqlite3_int64)p;
  aIdx._4_4_ = fts3SqlStmt(p,0x23,&pUpdate,(sqlite3_value **)0x0);
  if (aIdx._4_4_ == 0) {
    sqlite3_bind_int64(pUpdate,1,sStack_18);
    while (iVar1 = sqlite3_step(pUpdate), iVar1 == 100) {
      pvVar2 = _nAlloc;
      if (local_30 <= i) {
        local_30 = local_30 + 0x10;
        pvVar2 = sqlite3_realloc(_nAlloc,local_30 * 4);
        if (pvVar2 == (void *)0x0) {
          aIdx._4_4_ = 7;
          break;
        }
      }
      _nAlloc = pvVar2;
      iVar1 = sqlite3_column_int(pUpdate,0);
      *(int *)((long)_nAlloc + (long)i * 4) = iVar1;
      i = i + 1;
    }
    iVar1 = sqlite3_reset(pUpdate);
    if (aIdx._4_4_ == 0) {
      aIdx._4_4_ = iVar1;
    }
  }
  if (aIdx._4_4_ == 0) {
    aIdx._4_4_ = fts3SqlStmt((Fts3Table *)iAbsLevel_local,0x1f,&stack0xffffffffffffffb8,
                             (sqlite3_value **)0x0);
  }
  if (aIdx._4_4_ == 0) {
    sqlite3_bind_int64(psStack_48,2,sStack_18);
  }
  *(undefined1 *)(iAbsLevel_local + 0x1c8) = 1;
  for (pSelect._4_4_ = 0; aIdx._4_4_ == 0 && pSelect._4_4_ < i; pSelect._4_4_ = pSelect._4_4_ + 1) {
    if (*(int *)((long)_nAlloc + (long)pSelect._4_4_ * 4) != pSelect._4_4_) {
      sqlite3_bind_int(psStack_48,3,*(int *)((long)_nAlloc + (long)pSelect._4_4_ * 4));
      sqlite3_bind_int(psStack_48,1,pSelect._4_4_);
      sqlite3_step(psStack_48);
      aIdx._4_4_ = sqlite3_reset(psStack_48);
    }
  }
  *(undefined1 *)(iAbsLevel_local + 0x1c8) = 0;
  sqlite3_free(_nAlloc);
  return aIdx._4_4_;
}

Assistant:

static int fts3RepackSegdirLevel(
  Fts3Table *p,                   /* FTS3 table handle */
  sqlite3_int64 iAbsLevel         /* Absolute level to repack */
){
  int rc;                         /* Return code */
  int *aIdx = 0;                  /* Array of remaining idx values */
  int nIdx = 0;                   /* Valid entries in aIdx[] */
  int nAlloc = 0;                 /* Allocated size of aIdx[] */
  int i;                          /* Iterator variable */
  sqlite3_stmt *pSelect = 0;      /* Select statement to read idx values */
  sqlite3_stmt *pUpdate = 0;      /* Update statement to modify idx values */

  rc = fts3SqlStmt(p, SQL_SELECT_INDEXES, &pSelect, 0);
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int64(pSelect, 1, iAbsLevel);
    while( SQLITE_ROW==sqlite3_step(pSelect) ){
      if( nIdx>=nAlloc ){
        int *aNew;
        nAlloc += 16;
        aNew = sqlite3_realloc(aIdx, nAlloc*sizeof(int));
        if( !aNew ){
          rc = SQLITE_NOMEM;
          break;
        }
        aIdx = aNew;
      }
      aIdx[nIdx++] = sqlite3_column_int(pSelect, 0);
    }
    rc2 = sqlite3_reset(pSelect);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  if( rc==SQLITE_OK ){
    rc = fts3SqlStmt(p, SQL_SHIFT_SEGDIR_ENTRY, &pUpdate, 0);
  }
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pUpdate, 2, iAbsLevel);
  }

  assert( p->bIgnoreSavepoint==0 );
  p->bIgnoreSavepoint = 1;
  for(i=0; rc==SQLITE_OK && i<nIdx; i++){
    if( aIdx[i]!=i ){
      sqlite3_bind_int(pUpdate, 3, aIdx[i]);
      sqlite3_bind_int(pUpdate, 1, i);
      sqlite3_step(pUpdate);
      rc = sqlite3_reset(pUpdate);
    }
  }
  p->bIgnoreSavepoint = 0;

  sqlite3_free(aIdx);
  return rc;
}